

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  u8 uVar1;
  anon_union_8_17_dfc45e9e_for_u p;
  ExprList *pEVar2;
  SrcList *pSVar3;
  Expr *pEVar4;
  With *pWVar5;
  Parse *pPVar6;
  anon_union_8_17_dfc45e9e_for_u *paVar7;
  Window *p_00;
  anon_union_8_17_dfc45e9e_for_u aVar8;
  Walker *pWVar9;
  Select *pRet;
  anon_union_8_17_dfc45e9e_for_u local_68;
  Walker local_60;
  
  local_68.pNC = (NameContext *)0x0;
  paVar7 = &local_68;
  aVar8.pNC = (NameContext *)0x0;
  do {
    if (pDup == (Select *)0x0) {
      return (Select *)local_68.pNC;
    }
    p.pNC = (NameContext *)sqlite3DbMallocRawNN(db,0x80);
    if ((Select *)p.pNC == (Select *)0x0) {
      return (Select *)local_68.pNC;
    }
    pEVar2 = sqlite3ExprListDup(db,pDup->pEList,flags);
    (p.pSelect)->pEList = pEVar2;
    pSVar3 = sqlite3SrcListDup(db,pDup->pSrc,flags);
    (p.pSelect)->pSrc = pSVar3;
    pEVar4 = sqlite3ExprDup(db,pDup->pWhere,flags);
    (p.pSelect)->pWhere = pEVar4;
    pEVar2 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
    (p.pSelect)->pGroupBy = pEVar2;
    pEVar4 = sqlite3ExprDup(db,pDup->pHaving,flags);
    (p.pSelect)->pHaving = pEVar4;
    pEVar2 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
    (p.pSelect)->pOrderBy = pEVar2;
    *p.pCCurHint = (CCurHint)pDup->op;
    (p.pSrcList)->a[0].colUsed = (Bitmask)aVar8;
    (p.pSrcList)->a[0].u3.pOn = (Expr *)0x0;
    pEVar4 = sqlite3ExprDup(db,pDup->pLimit,flags);
    (p.pSelect)->pLimit = pEVar4;
    (p.pNC)->pSrcList = (SrcList *)0x0;
    (p.pSrcList)->nAlloc = pDup->selFlags & 0xffffffdf;
    ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[0] = -1;
    ((int *)((long)&(p.pRefSrcList)->nExclude + 4))[1] = -1;
    (p.pSelect)->nSelectRow = pDup->nSelectRow;
    pWVar5 = sqlite3WithDup(db,pDup->pWith);
    (p.pSelect)->pWith = pWVar5;
    (p.pSelect)->pWin = (Window *)0x0;
    p_00 = pDup->pWinDefn;
    local_60.pParse = (Parse *)0x0;
    pWVar9 = &local_60;
    for (; p_00 != (Window *)0x0; p_00 = p_00->pNextWin) {
      pPVar6 = (Parse *)sqlite3WindowDup(db,(Expr *)0x0,p_00);
      pWVar9->pParse = pPVar6;
      if (pPVar6 == (Parse *)0x0) break;
      pWVar9 = (Walker *)&pPVar6->iSelfTab;
    }
    (p.pSelect)->pWinDefn = (Window *)local_60.pParse;
    uVar1 = db->mallocFailed;
    if (pDup->pWin != (Window *)0x0) {
      if (uVar1 != '\0') {
        (p.pSelect)->selId = pDup->selId;
        goto LAB_001990c6;
      }
      local_60.xExprCallback = gatherSelectWindowsCallback;
      local_60.xSelectCallback = gatherSelectWindowsSelectCallback;
      local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_60.pParse = (Parse *)0x0;
      local_60.u.pNC = p.pNC;
      sqlite3WalkSelect(&local_60,p.pSelect);
      uVar1 = db->mallocFailed;
    }
    (p.pSelect)->selId = pDup->selId;
    if (uVar1 != '\0') {
LAB_001990c6:
      (p.pSrcList)->a[0].colUsed = 0;
      sqlite3SelectDelete(db,p.pSelect);
      return (Select *)local_68.pNC;
    }
    paVar7->pSelect = (Select *)p;
    pDup = pDup->pPrior;
    paVar7 = (anon_union_8_17_dfc45e9e_for_u *)&(p.pSrcList)->a[0].u3;
    aVar8.pNC = p.pNC;
  } while( true );
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, const Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  const Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = sqlite3WithDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin && db->mallocFailed==0 ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    if( db->mallocFailed ){
      /* Any prior OOM might have left the Select object incomplete.
      ** Delete the whole thing rather than allow an incomplete Select
      ** to be used by the code generator. */
      pNew->pNext = 0;
      sqlite3SelectDelete(db, pNew);
      break;
    }
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}